

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O1

UEnumeration * ures_getKeywordValues_63(char *path,char *keyword,UErrorCode *status)

{
  int iVar1;
  char *pcVar2;
  UResourceBundle *resB;
  UResourceBundle *pUVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  UEnumeration *pUVar7;
  ulong uVar8;
  UErrorCode subStatus;
  int32_t locLen;
  UResourceBundle subItem;
  UResourceBundle item;
  char valuesBuf [2048];
  char *valuesList [512];
  uint local_1a08;
  UErrorCode local_1a04;
  ulong local_1a00;
  UErrorCode *local_19f8;
  uint local_19f0;
  int32_t local_19ec;
  UEnumeration *local_19e8;
  UResourceBundle *local_19e0;
  char *local_19d8;
  char *local_19d0;
  UResourceBundle local_19c8;
  UResourceBundle local_1900;
  char local_1838 [2048];
  undefined8 auStack_1038 [513];
  
  memset(&local_1900,0,200);
  memset(&local_19c8,0,200);
  local_19e8 = ures_openAvailableLocales_63(path,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_1a00 = 0;
    local_1838[0] = '\0';
    local_1838[1] = '\0';
    local_19d0 = keyword;
    pcVar2 = uenum_next_63(local_19e8,&local_19ec,status);
    if (pcVar2 != (char *)0x0) {
      local_1a00 = 0;
      local_1a08 = 0;
      local_19f8 = status;
      local_19d8 = path;
      do {
        local_1a04 = U_ZERO_ERROR;
        resB = ures_openWithType((UResourceBundle *)0x0,local_19d8,pcVar2,URES_OPEN_DIRECT,
                                 &local_1a04);
        ures_getByKey_63(resB,local_19d0,&local_1900,&local_1a04);
        if ((resB != (UResourceBundle *)0x0) && (local_1a04 < U_ILLEGAL_ARGUMENT_ERROR)) {
LAB_002d2545:
          do {
            do {
              local_19e0 = resB;
              pUVar3 = ures_getNextResource_63(&local_1900,&local_19c8,&local_1a04);
              resB = local_19e0;
              if ((pUVar3 == (UResourceBundle *)0x0) || (U_ZERO_ERROR < local_1a04))
              goto LAB_002d266b;
              pcVar2 = pUVar3->fKey;
            } while ((((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) ||
                     (iVar1 = strcmp(pcVar2,"default"), resB = local_19e0, iVar1 == 0)) ||
                    (iVar1 = strncmp(pcVar2,"private-",8), resB = local_19e0, iVar1 == 0));
            if (0 < (int)local_1a08) {
              uVar8 = 0;
              do {
                iVar1 = strcmp((char *)auStack_1038[uVar8],pcVar2);
                status = local_19f8;
                if (iVar1 == 0) {
                  pcVar2 = (char *)0x0;
                  break;
                }
                uVar8 = uVar8 + 1;
              } while (local_1a08 != uVar8);
            }
            resB = local_19e0;
          } while (pcVar2 == (char *)0x0);
          if ((int)local_1a08 < 0x1ff) {
            sVar4 = strlen(pcVar2);
            iVar1 = (int)sVar4 + (int)local_1a00;
            if (iVar1 < 0x7fe) {
              local_19f0 = iVar1 + 1;
              lVar5 = (long)(int)local_1a00;
              strcpy(local_1838 + lVar5,pcVar2);
              lVar6 = (long)(int)local_1a08;
              local_1a08 = local_1a08 + 1;
              auStack_1038[lVar6] = local_1838 + lVar5;
              local_1838[iVar1] = '\0';
              local_1a00 = (ulong)local_19f0;
              status = local_19f8;
              resB = local_19e0;
              goto LAB_002d2545;
            }
          }
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          resB = local_19e0;
          goto LAB_002d2545;
        }
LAB_002d266b:
        ures_closeBundle(resB,'\x01');
        pcVar2 = uenum_next_63(local_19e8,&local_19ec,status);
      } while (pcVar2 != (char *)0x0);
    }
    iVar1 = (int)local_1a00;
    local_1838[iVar1] = '\0';
    ures_closeBundle(&local_1900,'\x01');
    ures_closeBundle(&local_19c8,'\x01');
    uenum_close_63(local_19e8);
    pUVar7 = uloc_openKeywordList_63(local_1838,iVar1 + 1,status);
  }
  else {
    ures_closeBundle(&local_1900,'\x01');
    ures_closeBundle(&local_19c8,'\x01');
    pUVar7 = (UEnumeration *)0x0;
  }
  return pUVar7;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
ures_getKeywordValues(const char *path, const char *keyword, UErrorCode *status)
{
#define VALUES_BUF_SIZE 2048
#define VALUES_LIST_SIZE 512
    
    char       valuesBuf[VALUES_BUF_SIZE];
    int32_t    valuesIndex = 0;
    const char *valuesList[VALUES_LIST_SIZE];
    int32_t    valuesCount = 0;
    
    const char *locale;
    int32_t     locLen;
    
    UEnumeration *locs = NULL;
    
    UResourceBundle    item;
    UResourceBundle    subItem;
    
    ures_initStackObject(&item);
    ures_initStackObject(&subItem);
    locs = ures_openAvailableLocales(path, status);
    
    if(U_FAILURE(*status)) {
        ures_close(&item);
        ures_close(&subItem);
        return NULL;
    }
    
    valuesBuf[0]=0;
    valuesBuf[1]=0;
    
    while((locale = uenum_next(locs, &locLen, status)) != 0) {
        UResourceBundle   *bund = NULL;
        UResourceBundle   *subPtr = NULL;
        UErrorCode subStatus = U_ZERO_ERROR; /* don't fail if a bundle is unopenable */
        bund = ures_openDirect(path, locale, &subStatus);
        
#if defined(URES_TREE_DEBUG)
        if(!bund || U_FAILURE(subStatus)) {
            fprintf(stderr, "%s-%s values: Can't open %s locale - skipping. (%s)\n", 
                path?path:"<ICUDATA>", keyword, locale, u_errorName(subStatus));
        }
#endif
        
        ures_getByKey(bund, keyword, &item, &subStatus);
        
        if(!bund || U_FAILURE(subStatus)) {
#if defined(URES_TREE_DEBUG)
            fprintf(stderr, "%s-%s values: Can't find in %s - skipping. (%s)\n", 
                path?path:"<ICUDATA>", keyword, locale, u_errorName(subStatus));
#endif
            ures_close(bund);
            bund = NULL;
            continue;
        }
        
        while((subPtr = ures_getNextResource(&item,&subItem,&subStatus)) != 0
            && U_SUCCESS(subStatus)) {
            const char *k;
            int32_t i;
            k = ures_getKey(subPtr);

#if defined(URES_TREE_DEBUG)
            /* fprintf(stderr, "%s | %s | %s | %s\n", path?path:"<ICUDATA>", keyword, locale, k); */
#endif
            if(k == NULL || *k == 0 ||
                    uprv_strcmp(k, DEFAULT_TAG) == 0 || uprv_strncmp(k, "private-", 8) == 0) {
                // empty or "default" or unlisted type
                continue;
            }
            for(i=0; i<valuesCount; i++) {
                if(!uprv_strcmp(valuesList[i],k)) {
                    k = NULL; /* found duplicate */
                    break;
                }
            }
            if(k != NULL) {
                int32_t kLen = (int32_t)uprv_strlen(k);
                if((valuesCount >= (VALUES_LIST_SIZE-1)) ||       /* no more space in list .. */
                    ((valuesIndex+kLen+1+1) >= VALUES_BUF_SIZE)) { /* no more space in buffer (string + 2 nulls) */
                    *status = U_ILLEGAL_ARGUMENT_ERROR; /* out of space.. */
                } else {
                    uprv_strcpy(valuesBuf+valuesIndex, k);
                    valuesList[valuesCount++] = valuesBuf+valuesIndex;
                    valuesIndex += kLen;
#if defined(URES_TREE_DEBUG)
                    fprintf(stderr, "%s | %s | %s | [%s]   (UNIQUE)\n",
                        path?path:"<ICUDATA>", keyword, locale, k);
#endif
                    valuesBuf[valuesIndex++] = 0; /* terminate */
                }
            }
        }
        ures_close(bund);
    }
    valuesBuf[valuesIndex++] = 0; /* terminate */
    
    ures_close(&item);
    ures_close(&subItem);
    uenum_close(locs);
#if defined(URES_TREE_DEBUG)
    fprintf(stderr, "%s:  size %d, #%d\n", u_errorName(*status), 
        valuesIndex, valuesCount);
#endif
    return uloc_openKeywordList(valuesBuf, valuesIndex, status);
}